

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supercell.cpp
# Opt level: O3

void CIF::calculateTiling
               (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *basis,double x_width,double y_width,double z_width,Vector3i *mins,Vector3i *maxs)

{
  double *pdVar1;
  double dVar2;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar3;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *pCVar4;
  ulong uVar5;
  CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *pCVar6;
  char *__function;
  long lVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  MatrixXd cuboid;
  MatrixXd affine_cube;
  MatrixXd affine_basis;
  Vector4d temp_row;
  Matrix4d real_basis;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> local_258;
  double local_220;
  double local_218;
  double local_210;
  DenseStorage<double,__1,__1,__1,_0> local_208;
  double *local_1f0;
  double local_1e8;
  Scalar local_1e0;
  DenseStorage<double,__1,__1,__1,_0> local_1d8;
  long local_1c0;
  DenseStorage<double,__1,__1,__1,_0> *local_1b8;
  DenseStorage<double,__1,__1,__1,_0> *local_1b0;
  Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>
  local_1a8;
  Scalar local_190;
  DenseStorage<double,__1,__1,__1,_0> local_188;
  Matrix<double,_4,_1,_0,_4,_1> local_168;
  double *local_140;
  double *local_138;
  double local_130;
  Scalar local_128;
  Scalar local_120;
  Scalar local_118;
  Scalar local_110;
  Scalar local_108;
  Scalar local_100;
  Scalar local_f8;
  Scalar local_f0;
  Scalar local_e8;
  Scalar local_e0;
  Scalar local_d8;
  Scalar local_d0;
  Scalar local_c8;
  Scalar local_c0;
  Matrix<double,_4,_4,_0,_4,_4> local_b8;
  
  local_188.m_data = (double *)0x0;
  local_188.m_rows = 0;
  local_188.m_cols = 0;
  local_220 = z_width;
  local_218 = y_width;
  local_210 = x_width;
  local_1b8 = (DenseStorage<double,__1,__1,__1,_0> *)mins;
  local_1b0 = (DenseStorage<double,__1,__1,__1,_0> *)maxs;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_188,0xc,3,4);
  local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       0.0;
  local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       4.94065645841247e-324;
  local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
       4.94065645841247e-324;
  local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (double)&local_188;
  if ((local_188.m_rows < 1) || (local_188.m_cols < 1)) goto LAB_00133f75;
  *local_188.m_data = 0.0;
  local_258.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.m_data =
       (PointerType)0x3ff0000000000000;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_b8,
                      (Scalar *)&local_258);
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,(Scalar *)&local_168);
  local_208.m_data = (double *)0x0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,(Scalar *)&local_208);
  local_1d8.m_data = (double *)0x0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,(Scalar *)&local_1d8);
  local_1a8.m_lhs.m_lhs = (LhsNested)0x0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,(Scalar *)&local_1a8);
  local_1e0 = 1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_1e0);
  local_190 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_190);
  local_110 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_110);
  local_118 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_118);
  local_120 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_120);
  local_128 = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar3,&local_128);
  dVar9 = *(double *)
           ((long)local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[0] + 0x10);
  if ((long)local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[3] +
      (long)local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[1] ==
      *(Index *)((long)local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0] + 8)) {
LAB_0013364b:
    if (local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
        [2] == dVar9) {
      local_258.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.m_data
           = (PointerType)&local_b8;
      local_258.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>._8_8_ =
           0;
      local_258.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.m_cols.
      m_value = 1;
      local_258.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.m_xpr =
           (XprTypeNested)0x1;
      local_b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0] = 1.0;
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
      [0] = 1.0;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&local_258,
                          (Scalar *)&local_168);
      local_208.m_data = (double *)0x3ff0000000000000;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar4,(Scalar *)&local_208);
      local_1d8.m_data = (double *)0x3ff0000000000000;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar4,(Scalar *)&local_1d8);
      local_1a8.m_lhs.m_lhs = (LhsNested)0x0;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar4,(Scalar *)&local_1a8);
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar4,(Scalar *)
                                 (basis->
                                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar4,(Scalar *)
                                 ((basis->
                                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1));
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar4,(Scalar *)
                                 ((basis->
                                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 2));
      local_1e0 = 0.0;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar4,&local_1e0);
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar4,(double *)
                                 ((long)&(((basis->
                                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                         ).m_storage.m_data + 8));
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar4,(double *)
                                 ((long)&(basis->
                                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start[1].
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                         .m_storage.m_data + 8));
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar4,(double *)
                                 ((long)&(basis->
                                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start[2].
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                         .m_storage.m_data + 8));
      local_190 = 0.0;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar4,&local_190);
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar4,(double *)
                                 ((long)&(((basis->
                                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                         ).m_storage.m_data + 0x10));
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                         (pCVar4,(double *)
                                 ((long)&(basis->
                                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start[1].
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                         .m_storage.m_data + 0x10));
      Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                (pCVar4,(double *)
                        ((long)&(basis->
                                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[2].
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                m_storage.m_data + 0x10));
      if (((long)&(local_258.
                   super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                  .m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> +
           local_258.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
           _8_8_ != 4) ||
         (local_258.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
          m_cols.m_value != 4)) {
        __function = 
        "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 4, 4>>::finished() [MatrixType = Eigen::Matrix<double, 4, 4>]"
        ;
        goto LAB_001340b6;
      }
      if (local_188.m_cols != 4) {
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                      "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Inverse<Eigen::Matrix<double, 4, 4>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Inverse<Eigen::Matrix<double, 4, 4>>, Option = 0]"
                     );
      }
      local_208.m_data = (double *)0x0;
      local_208.m_rows = 0;
      local_208.m_cols = 0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_208,0x20,8,4);
      local_258.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>._8_8_ =
           0;
      local_258.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.m_cols.
      m_value = 1;
      local_258.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.m_xpr =
           (XprTypeNested)0x1;
      local_258.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.m_data
           = (PointerType)&local_208;
      if ((local_208.m_rows < 1) || (local_208.m_cols < 1)) {
LAB_00133f75:
        __assert_fail("m_xpr.rows() > 0 && m_xpr.cols() > 0 && \"Cannot comma-initialize a 0x0 matrix (operator<<)\""
                      ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x25,
                      "Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::CommaInitializer(XprType &, const Scalar &) [MatrixType = Eigen::Matrix<double, -1, -1>]"
                     );
      }
      *local_208.m_data = 1.0;
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
      [0] = 0.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_258,
                          (Scalar *)&local_168);
      local_1d8.m_data = (double *)0x0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar3,(Scalar *)&local_1d8);
      local_1a8.m_lhs.m_lhs = (LhsNested)0x0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar3,(Scalar *)&local_1a8);
      local_1e0 = 1.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar3,&local_1e0);
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar3,&local_210);
      local_190 = 0.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar3,&local_190);
      local_110 = 0.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar3,&local_110);
      local_118 = 1.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar3,&local_118);
      local_120 = 0.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar3,&local_120);
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar3,&local_218);
      local_128 = 0.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar3,&local_128);
      local_c0 = 1.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar3,&local_c0);
      local_c8 = 0.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar3,&local_c8);
      local_d0 = 0.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar3,&local_d0);
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar3,&local_220);
      local_d8 = 1.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar3,&local_d8);
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar3,&local_210);
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar3,&local_218);
      local_e0 = 0.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar3,&local_e0);
      local_e8 = 1.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar3,&local_e8);
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar3,&local_210);
      local_f0 = 0.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar3,&local_f0);
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar3,&local_220);
      local_f8 = 1.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar3,&local_f8);
      local_100 = 0.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar3,&local_100);
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar3,&local_218);
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar3,&local_220);
      local_108 = 1.0;
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar3,&local_108);
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar3,&local_210);
      pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                         (pCVar3,&local_218);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                (pCVar3,&local_220);
      uVar5 = *(Index *)((long)local_258.
                               super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                               .
                               super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                               .
                               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
                               .
                               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
                               .m_data + 0x10);
      if ((long)&(local_258.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                 .m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> +
          local_258.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
          _8_8_ != *(Index *)((long)local_258.
                                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                                    .
                                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                                    .
                                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
                                    .
                                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
                                    .m_data + 8)) {
        if (uVar5 != 0) goto LAB_00133f5b;
        uVar5 = 0;
      }
      if (local_258.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
          m_cols.m_value == uVar5) {
        local_1d8.m_data = (double *)0x0;
        local_1d8.m_rows = 0;
        local_1d8.m_cols = 0;
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_1d8,0x18,8,3);
        if (0 < local_208.m_rows) {
          lVar7 = 0;
          do {
            if (local_208.m_cols < 0 && local_208.m_data != (double *)0x0) {
LAB_00133efe:
              __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                            ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                            "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, Level = 0]"
                           );
            }
            if (local_208.m_cols != 4) {
              __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                            ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                            "void Eigen::PlainObjectBase<Eigen::Matrix<double, 4, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 4, 1>]"
                           );
            }
            pdVar1 = local_208.m_data + lVar7;
            local_168.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
            array[0] = *pdVar1;
            local_168.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
            array[1] = pdVar1[local_208.m_rows];
            local_168.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
            array[2] = pdVar1[local_208.m_rows * 2];
            local_168.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
            array[3] = pdVar1[local_208.m_rows * 3];
            local_1a8.m_lhs.m_rhs.m_xpr = &local_b8;
            local_1a8.m_rhs = &local_168;
            local_258.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
            m_data = local_1d8.m_data + lVar7;
            local_258.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
            m_cols.m_value = local_1d8.m_cols;
            local_1a8.m_lhs.m_lhs = (LhsNested)&local_188;
            if (local_1d8.m_cols < 0 && local_1d8.m_data != (double *)0x0) goto LAB_00133efe;
            local_258.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
            m_startCol.m_value = 0;
            local_258.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
            m_outerStride = 1;
            local_258.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
            m_xpr = (XprTypeNested)&local_1d8;
            local_258.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
            m_startRow.m_value = lVar7;
            if (local_1d8.m_rows <= lVar7) {
              __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                            ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                            "Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                           );
            }
            Eigen::internal::
            call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,0>,Eigen::Matrix<double,4,1,0,4,1>,0>,Eigen::internal::assign_op<double,double>>
                      (&local_258,&local_1a8,(assign_op<double,_double> *)&local_1e0,(type)0x0);
            lVar7 = lVar7 + 1;
          } while (lVar7 < local_208.m_rows);
        }
        local_258.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
        m_data = (PointerType)local_1b0;
        local_258.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>._8_8_
             = 0;
        local_258.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
        m_cols.m_value = 1;
        local_258.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.m_xpr =
             (XprTypeNested)0x1;
        *(undefined4 *)&local_1b0->m_data = 0;
        local_168.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
        array[0] = (double)((ulong)local_168.
                                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                   m_storage.m_data.array[0] & 0xffffffff00000000);
        pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
                           ((CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)&local_258,
                            (Scalar *)&local_168);
        local_1a8.m_lhs.m_lhs = (LhsNested)((ulong)local_1a8.m_lhs.m_lhs & 0xffffffff00000000);
        Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
                  (pCVar6,(Scalar *)&local_1a8);
        if (((long)&(local_258.
                     super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                    .m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> +
             local_258.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
             _8_8_ == 3) &&
           (local_258.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
            m_cols.m_value == 1)) {
          local_258.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
          m_data = (PointerType)local_1b8;
          local_258.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
          _8_8_ = 0;
          local_258.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
          m_cols.m_value = 1;
          local_258.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.m_xpr
               = (XprTypeNested)0x1;
          *(undefined4 *)&local_1b8->m_data = 0xffffffff;
          local_168.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
          array[0] = (double)CONCAT44(local_168.
                                      super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                      m_storage.m_data.array[0]._4_4_,0xffffffff);
          pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
                             ((CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)&local_258,
                              (Scalar *)&local_168);
          local_1a8.m_lhs.m_lhs = (LhsNested)CONCAT44(local_1a8.m_lhs.m_lhs._4_4_,0xffffffff);
          Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
                    (pCVar6,(Scalar *)&local_1a8);
          if (((long)&(local_258.
                       super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                      .m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> +
               local_258.
               super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
               .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
               ._8_8_ == 3) &&
             (local_258.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
              .m_cols.m_value == 1)) {
            local_1f0 = local_1d8.m_data;
            local_1c0 = local_1d8.m_rows;
            if (0 < local_1d8.m_rows) {
              if (((local_1d8.m_cols < 1) || (local_1d8.m_cols == 1)) ||
                 ((ulong)local_1d8.m_cols < 3)) {
                __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                              "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                              "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                             );
              }
              local_138 = local_1d8.m_data + local_1d8.m_rows * 2;
              local_140 = local_1d8.m_data + local_1d8.m_rows;
              lVar7 = 0;
              do {
                dVar9 = local_1f0[lVar7];
                local_1e8 = (double)(int)((uint)(0.0 < dVar9) - (uint)(dVar9 < 0.0));
                dVar9 = ceil(ABS(dVar9));
                lVar8 = (long)(dVar9 * local_1e8);
                dVar9 = local_140[lVar7];
                local_130 = ceil(ABS(dVar9));
                dVar2 = local_138[lVar7];
                local_1e8 = (double)CONCAT71(local_1e8._1_7_,0.0 < dVar2);
                dVar10 = ceil(ABS(dVar2));
                if (*(int *)&local_1b0->m_data < lVar8) {
                  *(int *)&local_1b0->m_data = (int)lVar8;
                }
                if (lVar8 < *(int *)&local_1b8->m_data) {
                  *(int *)&local_1b8->m_data = (int)lVar8;
                }
                lVar8 = (long)(local_130 * (double)(int)((uint)(0.0 < dVar9) - (uint)(dVar9 < 0.0)))
                ;
                if (*(int *)((long)&local_1b0->m_data + 4) < lVar8) {
                  *(int *)((long)&local_1b0->m_data + 4) = (int)lVar8;
                }
                if (lVar8 < *(int *)((long)&local_1b8->m_data + 4)) {
                  *(int *)((long)&local_1b8->m_data + 4) = (int)lVar8;
                }
                lVar8 = (long)(dVar10 * (double)(int)((uint)local_1e8._0_1_ - (uint)(dVar2 < 0.0)));
                if ((int)local_1b0->m_rows < lVar8) {
                  *(int *)&local_1b0->m_rows = (int)lVar8;
                }
                if (lVar8 < (int)local_1b8->m_rows) {
                  *(int *)&local_1b8->m_rows = (int)lVar8;
                }
                lVar7 = lVar7 + 1;
              } while (local_1c0 != lVar7);
            }
            free(local_1f0);
            free(local_208.m_data);
            free(local_188.m_data);
            return;
          }
        }
        __function = 
        "XprType &Eigen::CommaInitializer<Eigen::Matrix<int, 3, 1>>::finished() [MatrixType = Eigen::Matrix<int, 3, 1>]"
        ;
        goto LAB_001340b6;
      }
    }
  }
  else if (dVar9 == 0.0) {
    dVar9 = 0.0;
    goto LAB_0013364b;
  }
LAB_00133f5b:
  __function = 
  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::finished() [MatrixType = Eigen::Matrix<double, -1, -1>]"
  ;
LAB_001340b6:
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,__function);
}

Assistant:

void calculateTiling(std::vector<Eigen::Vector3d> &basis, double x_width, double y_width, double z_width,
                         Eigen::Vector3i &mins, Eigen::Vector3i &maxs) {
        Eigen::MatrixXd affine_basis(3, 4);
        affine_basis << 0.0, 1.0, 0.0, 0.0,
                0.0, 0.0, 1.0, 0.0,
                0.0, 0.0, 0.0, 1.0;

        Eigen::Matrix4d real_basis;
        real_basis << 1.0, 1.0, 1.0, 1.0,
                0.0, basis[0](0), basis[1](0), basis[2](0),
                0.0, basis[0](1), basis[1](1), basis[2](1),
                0.0, basis[0](2), basis[1](2), basis[2](2);

        auto affine_transform_matrix = affine_basis * real_basis.inverse();

        Eigen::MatrixXd cuboid(8, 4);
        cuboid << 1.0, 0.0, 0.0, 0.0,
                1.0, x_width, 0.0, 0.0,
                1.0, 0.0, y_width, 0.0,
                1.0, 0.0, 0.0, z_width,
                1.0, x_width, y_width, 0,
                1.0, x_width, 0.0, z_width,
                1.0, 0.0, y_width, z_width,
                1.0, x_width, y_width, z_width;

        // affine transform the cuboid
        Eigen::MatrixXd affine_cube(8, 3);
        for (int i = 0; i < cuboid.rows(); ++i) {
            Eigen::Vector4d temp_row = cuboid.row(i);
            affine_cube.row(i) = affine_transform_matrix * temp_row;
        }

        // get the limits of the cube in affine space
        long max = std::numeric_limits<long>::min();
        long min = std::numeric_limits<long>::max();

        maxs << max, max, max;
        mins << min, min, min;

        for (int i = 0; i < affine_cube.rows(); ++i) {
            long rnd_x = (long) sgn(affine_cube(i, 0)) * std::ceil(std::abs(affine_cube(i, 0)));
            long rnd_y = (long) sgn(affine_cube(i, 1)) * std::ceil(std::abs(affine_cube(i, 1)));
            long rnd_z = (long) sgn(affine_cube(i, 2)) * std::ceil(std::abs(affine_cube(i, 2)));

            if (rnd_x > maxs(0))
                maxs(0) = rnd_x;
            if (rnd_x < mins(0))
                mins(0) = rnd_x;
            if (rnd_y > maxs(1))
                maxs(1) = rnd_y;
            if (rnd_y < mins(1))
                mins(1) = rnd_y;
            if (rnd_z > maxs(2))
                maxs(2) = rnd_z;
            if (rnd_z < mins(2))
                mins(2) = rnd_z;
        }
    }